

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilSort.c
# Opt level: O1

uint Abc_Random(int fReset)

{
  if (fReset != 0) {
    Abc_Random::m_z = 0xdd8c5109;
    Abc_Random::m_w = 0x81962ff0;
  }
  Abc_Random::m_z = (Abc_Random::m_z >> 0x10) + (Abc_Random::m_z & 0xffff) * 0x9069;
  Abc_Random::m_w = (Abc_Random::m_w >> 0x10) + (Abc_Random::m_w & 0xffff) * 18000;
  return Abc_Random::m_z * 0x10000 + Abc_Random::m_w;
}

Assistant:

unsigned Abc_Random( int fReset )
{
    static unsigned int m_z = NUMBER1;
    static unsigned int m_w = NUMBER2;
    if ( fReset )
    {
        m_z = NUMBER1;
        m_w = NUMBER2;
    }
    m_z = 36969 * (m_z & 65535) + (m_z >> 16);
    m_w = 18000 * (m_w & 65535) + (m_w >> 16);
    return (m_z << 16) + m_w;
}